

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

IRNode * __thiscall kratos::Generator::get_child(Generator *this,uint64_t index)

{
  pointer psVar1;
  pointer pcVar2;
  pointer pbVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  ulong uVar8;
  element_type *peVar9;
  key_type local_44;
  undefined1 local_40 [8];
  mapped_type func_name;
  
  if (this->is_external_ == false) {
    psVar1 = (this->stmts_).
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->stmts_).
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4;
    if (index < uVar4) {
      return &(psVar1[index].super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_IRNode;
    }
    uVar8 = (this->funcs_)._M_t._M_impl.super__Rb_tree_header._M_node_count + uVar4;
    if (index < uVar8) {
      local_44 = (int)index - (int)uVar4;
      pmVar5 = std::
               map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::at(&this->func_index_,&local_44);
      local_40 = (undefined1  [8])&func_name._M_string_length;
      pcVar2 = (pmVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,pcVar2,pcVar2 + pmVar5->_M_string_length);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
               ::at(&this->funcs_,(key_type *)local_40);
      peVar9 = (pmVar6->super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    }
    else {
      if (uVar8 + (this->children_)._M_h._M_element_count <= index) goto LAB_0017642c;
      pbVar3 = (this->children_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_40 = (undefined1  [8])&func_name._M_string_length;
      pcVar2 = pbVar3[index - uVar8]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,pcVar2,pcVar2 + pbVar3[index - uVar8]._M_string_length);
      iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->children_)._M_h,(key_type *)local_40);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      peVar9 = *(element_type **)
                ((long)iVar7.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
                       ._M_cur + 0x28);
    }
    if (local_40 != (undefined1  [8])&func_name._M_string_length) {
      operator_delete((void *)local_40,func_name._M_string_length + 1);
    }
  }
  else {
LAB_0017642c:
    peVar9 = (element_type *)0x0;
  }
  return (IRNode *)peVar9;
}

Assistant:

IRNode *Generator::get_child(uint64_t index) {
    if (is_external_) return nullptr;
    if (index < stmts_count()) {
        return stmts_[index].get();
    } else if (index < stmts_count() + funcs_.size()) {
        auto i = index - stmts_count();
        auto func_name = func_index_.at(i);
        return funcs_.at(func_name).get();
    } else if (index < stmts_count() + funcs_.size() + get_child_generator_size()) {
        auto n = children_names_[index - stmts_count() - funcs_.size()];
        return children_.at(n).get();
    } else {
        return nullptr;
    }
}